

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AeronArchive.cpp
# Opt level: O0

void __thiscall aeron::archive::AeronArchive::checkForErrorResponse(AeronArchive *this)

{
  bool bVar1;
  uint16_t uVar2;
  int iVar3;
  Value VVar4;
  pointer pCVar5;
  int64_t iVar6;
  ulong uVar7;
  ArchiveException *this_00;
  string *__rhs;
  char *pcVar8;
  int in_ECX;
  nfds_t __nfds;
  pollfd *__fds;
  allocator local_f9;
  string local_f8;
  allocator local_d1;
  string local_d0;
  string local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  undefined1 local_20 [8];
  unique_lock<std::mutex> lock;
  AeronArchive *this_local;
  
  __fds = (pollfd *)&this->lock_;
  lock._8_8_ = this;
  std::unique_lock<std::mutex>::unique_lock((unique_lock<std::mutex> *)local_20,(mutex_type *)__fds)
  ;
  pCVar5 = std::
           unique_ptr<aeron::archive::ControlResponsePoller,_std::default_delete<aeron::archive::ControlResponsePoller>_>
           ::operator->(&this->controlResponsePoller_);
  iVar3 = ControlResponsePoller::poll(pCVar5,__fds,__nfds,in_ECX);
  if (iVar3 != 0) {
    pCVar5 = std::
             unique_ptr<aeron::archive::ControlResponsePoller,_std::default_delete<aeron::archive::ControlResponsePoller>_>
             ::operator->(&this->controlResponsePoller_);
    bVar1 = ControlResponsePoller::isPollComplete(pCVar5);
    if (bVar1) {
      pCVar5 = std::
               unique_ptr<aeron::archive::ControlResponsePoller,_std::default_delete<aeron::archive::ControlResponsePoller>_>
               ::operator->(&this->controlResponsePoller_);
      iVar6 = ControlResponsePoller::controlSessionId(pCVar5);
      if (iVar6 == this->controlSessionId_) {
        pCVar5 = std::
                 unique_ptr<aeron::archive::ControlResponsePoller,_std::default_delete<aeron::archive::ControlResponsePoller>_>
                 ::operator->(&this->controlResponsePoller_);
        uVar7 = ControlResponsePoller::templateId(pCVar5);
        uVar2 = io::aeron::archive::codecs::ControlResponse::sbeTemplateId();
        if (uVar7 == uVar2) {
          pCVar5 = std::
                   unique_ptr<aeron::archive::ControlResponsePoller,_std::default_delete<aeron::archive::ControlResponsePoller>_>
                   ::operator->(&this->controlResponsePoller_);
          VVar4 = ControlResponsePoller::code(pCVar5);
          if (VVar4 == ERROR) {
            this_00 = (ArchiveException *)__cxa_allocate_exception(0x48);
            pCVar5 = std::
                     unique_ptr<aeron::archive::ControlResponsePoller,_std::default_delete<aeron::archive::ControlResponsePoller>_>
                     ::operator->(&this->controlResponsePoller_);
            __rhs = ControlResponsePoller::errorMessage_abi_cxx11_(pCVar5);
            std::operator+(&local_90,"error: ",__rhs);
            std::operator+(&local_70,&local_90,", relevant id: ");
            pCVar5 = std::
                     unique_ptr<aeron::archive::ControlResponsePoller,_std::default_delete<aeron::archive::ControlResponsePoller>_>
                     ::operator->(&this->controlResponsePoller_);
            iVar6 = ControlResponsePoller::relevantId(pCVar5);
            std::__cxx11::to_string(&local_b0,iVar6);
            std::operator+(&local_50,&local_70,&local_b0);
            std::allocator<char>::allocator();
            std::__cxx11::string::string
                      ((string *)&local_d0,
                       "void aeron::archive::AeronArchive::checkForErrorResponse()",&local_d1);
            pcVar8 = aeron::util::past_prefix
                               ("/workspace/llm4binary/github/license_all_cmakelists_1510/fairtide[P]aeron-archive-client"
                                ,
                                "/workspace/llm4binary/github/license_all_cmakelists_1510/fairtide[P]aeron-archive-client/src/AeronArchive.cpp"
                               );
            std::allocator<char>::allocator();
            std::__cxx11::string::string((string *)&local_f8,pcVar8,&local_f9);
            ArchiveException::ArchiveException(this_00,&local_50,&local_d0,&local_f8,0x73);
            __cxa_throw(this_00,&ArchiveException::typeinfo,ArchiveException::~ArchiveException);
          }
        }
      }
    }
  }
  std::unique_lock<std::mutex>::~unique_lock((unique_lock<std::mutex> *)local_20);
  return;
}

Assistant:

void AeronArchive::checkForErrorResponse() {
    std::unique_lock<std::mutex> lock(lock_);

    if (controlResponsePoller_->poll() != 0 && controlResponsePoller_->isPollComplete()) {
        if (controlResponsePoller_->controlSessionId() == controlSessionId_ &&
            controlResponsePoller_->templateId() == codecs::ControlResponse::sbeTemplateId() &&
            controlResponsePoller_->code() == codecs::ControlResponseCode::ERROR) {
            throw ArchiveException("error: " + controlResponsePoller_->errorMessage() +
                                       ", relevant id: " + std::to_string(controlResponsePoller_->relevantId()),
                                   SOURCEINFO);
        }
    }
}